

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTangentFixedRadiusArc.cpp
# Opt level: O3

int TestTangentFixedRadiusArc(string *sFilePath)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  string sLine;
  ifstream infile;
  char *local_278;
  long local_270;
  char local_268 [16];
  string local_258;
  long local_238 [3];
  undefined4 uStack_21c;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238);
  lVar1 = *(long *)(local_238[0] + -0x18);
  *(undefined4 *)((long)&uStack_21c + lVar1) = 7;
  std::ios::clear((int)&local_278 + (int)lVar1 + 0x40);
  local_278 = local_268;
  local_270 = 0;
  local_268[0] = '\0';
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(sFilePath->_M_dataplus)._M_p);
  lVar1 = *(long *)(local_238[0] + -0x18);
  bVar6 = 1;
  if ((abStack_218[lVar1] & 2) == 0) {
    bVar5 = 1;
    bVar6 = 1;
    do {
      cVar2 = std::ios::widen((char)&local_278 + (char)lVar1 + '@');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar2);
      if (local_270 == 0) {
        uVar4 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0
                          );
        std::ifstream::~ifstream(local_238);
        _Unwind_Resume(uVar4);
      }
      if (*local_278 != '#') {
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_278,local_278 + local_270);
        bVar3 = ParseTestTangentFixedRadiusArc(&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        bVar6 = bVar5;
        if (!bVar3) {
          bVar5 = 0;
          bVar6 = 0;
        }
      }
      lVar1 = *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[lVar1] & 2) == 0);
  }
  std::ifstream::close();
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  std::ifstream::~ifstream(local_238);
  return (uint)bVar6;
}

Assistant:

int TestTangentFixedRadiusArc(const string &sFilePath)
{
    ifstream infile;
    infile.exceptions(ifstream::eofbit | ifstream::failbit | ifstream::badbit);
    int nCount = 0;
    int nCommentCount = 0;
    bool bPassed = true;
    try
    {
        string sLine;
        infile.open(sFilePath.c_str(), ifstream::in);

        while (!infile.eof())
        {
            getline(infile, sLine);
            if (sLine.at(0) == '#')
            {
                nCommentCount++;
            }
            else
            {
                if (!ParseTestTangentFixedRadiusArc(sLine))
                    bPassed = false;
                nCount++;
            }
        }
        infile.close();
        return bPassed;
    }

    catch (ifstream::failure e)
    {
        int nError = -99;
        // Per C++ standards for ifstream::failbit with global function getline
        // No characters were extracted because the end was prematurely found.Notice
        // that some eofbit cases will also set failbit.
        // In this case the end of the file is read and causes both flags to be raised,
        // so this presumably means all the data has been read correctly.
        if ((infile.rdstate() & ifstream::failbit) && (infile.rdstate() & ifstream::eofbit) != 0)
            nError = bPassed;
        else if ((infile.rdstate() & ifstream::failbit) != 0)
            nError = -1;
        else if ((infile.rdstate() & ifstream::badbit) != 0)
            nError = -2;
        else if ((infile.rdstate() & ifstream::eofbit) != 0)
            nError = -3;
        if (infile.is_open())
            infile.close();
        return nError;
    }
}